

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::ViewportArray::DepthRangeAPI::iterate(DepthRangeAPI *this)

{
  bool bVar1;
  uint uVar2;
  NotSupportedError *this_00;
  char *description;
  TestContext *this_01;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    uVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar2 & 0x300) == 0x100) {
      bVar1 = iterateHelper<double>(this,(double *)0x0);
    }
    else {
      bVar1 = iterateHelper<float>(this,(float *)0x0);
    }
    if (bVar1 == false) {
      this_01 = ((this->super_TestCaseBase).m_context)->m_testCtx;
      description = "Fail";
    }
    else {
      this_01 = ((this->super_TestCaseBase).m_context)->m_testCtx;
      description = "Pass";
    }
    tcu::TestContext::setTestResult(this_01,(uint)(bVar1 == false),description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x857);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult DepthRangeAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	bool					test_result;
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	if (glu::isContextTypeGLCore(context_type))
	{
		test_result = iterateHelper<GLdouble>();
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));
		test_result = iterateHelper<GLfloat>();
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}